

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_final(rhash ctx,uchar *first_result)

{
  long *plVar1;
  rhash_context_ext *local_c8;
  rhash_hash_info *info;
  rhash_context_ext *ectx;
  uchar *out;
  uchar buffer [130];
  uint i;
  uchar *first_result_local;
  rhash ctx_local;
  
  buffer[0x7c] = '\0';
  buffer[0x7d] = '\0';
  buffer[0x7e] = '\0';
  buffer[0x7f] = '\0';
  local_c8 = (rhash_context_ext *)first_result;
  if (first_result == (uchar *)0x0) {
    local_c8 = (rhash_context_ext *)&out;
  }
  ectx = local_c8;
  unique0x100001ad = first_result;
  if (10 < (uint)ctx[1].msg_size) {
    __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0x10b,"int rhash_final(rhash, unsigned char *)");
  }
  if ((ctx[1].msg_size & 0x300000000) != 0x300000000) {
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    for (; (uint)buffer._124_4_ < (uint)ctx[1].msg_size; buffer._124_4_ = buffer._124_4_ + 1) {
      plVar1 = *(long **)&ctx[(ulong)(uint)buffer._124_4_ + 3].hash_id;
      if (plVar1[5] == 0) {
        __assert_fail("info->final != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x114,"int rhash_final(rhash, unsigned char *)");
      }
      if (0x81 < *(ulong *)(*plVar1 + 8)) {
        __assert_fail("info->info->digest_size < sizeof(buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x115,"int rhash_final(rhash, unsigned char *)");
      }
      (*(code *)plVar1[5])(ctx[(ulong)(uint)buffer._124_4_ + 4].msg_size,ectx);
      ectx = (rhash_context_ext *)&out;
    }
    *(uint *)((long)&ctx[1].msg_size + 4) = *(uint *)((long)&ctx[1].msg_size + 4) | 2;
  }
  return 0;
}

Assistant:

RHASH_API int rhash_final(rhash ctx, unsigned char* first_result)
{
	unsigned i = 0;
	unsigned char buffer[130];
	unsigned char* out = (first_result ? first_result : buffer);
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);

	/* skip final call if already finalized and auto-final is on */
	if ((ectx->flags & RCTX_FINALIZED_MASK) ==
		(RCTX_AUTO_FINAL | RCTX_FINALIZED)) return 0;

	/* call final method for every algorithm */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		assert(info->final != 0);
		assert(info->info->digest_size < sizeof(buffer));
		info->final(ectx->vector[i].context, out);
		out = buffer;
	}
	ectx->flags |= RCTX_FINALIZED;
	return 0; /* no error processing at the moment */
}